

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

uint32_t __thiscall
cfd::core::ConfidentialTransaction::GetTxInIndex
          (ConfidentialTransaction *this,Txid *txid,uint32_t vout)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  CfdException *this_00;
  long lVar4;
  pointer pCVar5;
  long *plVar6;
  bool bVar7;
  size_t is_coinbase;
  undefined1 local_60 [16];
  _func_int *local_50 [2];
  Txid *local_40;
  long local_38;
  
  plVar6 = &local_38;
  local_38 = 0;
  local_40 = txid;
  wally_tx_is_coinbase((this->super_AbstractTransaction).wally_tx_pointer_,plVar6);
  uVar2 = vout & 0x3fffffff;
  if (local_38 != 0) {
    uVar2 = vout;
  }
  pCVar5 = (this->vin_).
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar7 = (this->vin_).
          super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
          ._M_impl.super__Vector_impl_data._M_finish != pCVar5;
  if (bVar7) {
    lVar4 = 0;
    plVar6 = (long *)0x0;
    do {
      AbstractTxIn::GetTxid
                ((Txid *)local_60,
                 (AbstractTxIn *)((long)&(pCVar5->super_AbstractTxIn)._vptr_AbstractTxIn + lVar4));
      bVar1 = Txid::Equals((Txid *)local_60,local_40);
      if (bVar1) {
        uVar3 = AbstractTxIn::GetVout
                          ((AbstractTxIn *)
                           ((long)&(((this->vin_).
                                     super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxIn)
                                   ._vptr_AbstractTxIn + lVar4));
        local_60._0_8_ = &PTR__Txid_0025aa88;
        if ((void *)CONCAT44(local_60._12_4_,local_60._8_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_60._12_4_,local_60._8_4_));
        }
        if (uVar3 == uVar2) break;
      }
      else {
        local_60._0_8_ = &PTR__Txid_0025aa88;
        if ((void *)CONCAT44(local_60._12_4_,local_60._8_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_60._12_4_,local_60._8_4_));
        }
      }
      plVar6 = (long *)((long)plVar6 + 1);
      pCVar5 = (this->vin_).
               super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x160;
      bVar7 = plVar6 < (long *)(((long)(this->vin_).
                                       super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar5 >>
                                5) * 0x2e8ba2e8ba2e8ba3);
    } while (bVar7);
  }
  if (!bVar7) {
    local_60._0_8_ = "cfdcore_elements_transaction.cpp";
    local_60._8_4_ = 0x5b9;
    local_50[0] = (_func_int *)0x21cc70;
    logger::log<>((CfdSourceLocation *)local_60,kCfdLogLevelWarning,"Txid is not found.");
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    local_60._0_8_ = local_50;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Txid is not found.","");
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_60);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return (uint32_t)plVar6;
}

Assistant:

uint32_t ConfidentialTransaction::GetTxInIndex(
    const Txid &txid, uint32_t vout) const {
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  size_t is_coinbase = 0;
  wally_tx_is_coinbase(tx_pointer, &is_coinbase);

  uint32_t index = (is_coinbase == 0) ? vout & kTxInVoutMask : vout;
  for (size_t i = 0; i < vin_.size(); ++i) {
    if (vin_[i].GetTxid().Equals(txid) && vin_[i].GetVout() == index) {
      return static_cast<uint32_t>(i);
    }
  }
  warn(CFD_LOG_SOURCE, "Txid is not found.");
  throw CfdException(kCfdIllegalArgumentError, "Txid is not found.");
}